

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<std::vector<bool,std::allocator<bool>>,void>
               (vector<bool,_std::allocator<bool>_> *container,ostream *os)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  char *pcVar4;
  ulong *puVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  char local_35 [5];
  
  local_35[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 2,1);
  puVar5 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar1 != 0 || puVar5 != puVar2) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      uVar3 = *puVar5;
      if (lVar7 == 0) {
LAB_001a6fa1:
        local_35[3] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 3,1);
        bVar8 = (1L << ((byte)uVar6 & 0x3f) & uVar3) == 0;
        pcVar4 = "true";
        if (bVar8) {
          pcVar4 = "false";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,(ulong)bVar8 | 4);
        lVar7 = lVar7 + 1;
        bVar8 = true;
      }
      else {
        local_35[4] = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 4,1);
        if (lVar7 != 0x20) goto LAB_001a6fa1;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar7 = 0x20;
        bVar8 = false;
      }
      if (!bVar8) break;
      bVar8 = uVar6 == 0x3f;
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + bVar8;
      if (bVar8) {
        uVar6 = 0;
      }
    } while (uVar6 != uVar1 || puVar5 != puVar2);
    if (lVar7 != 0) {
      local_35[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 1,1);
    }
  }
  local_35[0] = '}';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }